

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astLambdaNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_tuple_t binding;
  ulong local_e8;
  size_t i_1;
  size_t captureVectorSize;
  size_t i;
  size_t argumentNodeCount;
  size_t lambdaArgumentCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  sysbvm_astLambdaNode_t **lambdaNode;
  anon_struct_72_9_85cf892b gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.name = (sysbvm_tuple_t)(arguments + 1);
  memset(&lambdaNode,0,0x48);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  lambdaArgumentCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&lambdaArgumentCount);
  argumentNodeCount = 0;
  sVar2 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x40));
  for (captureVectorSize = 0; captureVectorSize < sVar2; captureVectorSize = captureVectorSize + 1)
  {
    lambdaNode = (sysbvm_astLambdaNode_t **)
                 sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x40),captureVectorSize);
    _Var1 = sysbvm_astArgumentNode_isForAll((sysbvm_tuple_t)lambdaNode);
    if (!_Var1) {
      argumentNodeCount = argumentNodeCount + 1;
    }
  }
  gcFrame.argumentNode = sysbvm_tuple_size_encode(context,argumentNodeCount);
  gcFrame.argumentCount =
       sysbvm_functionDefinition_create
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x10),
                  *(sysbvm_tuple_t *)(*arguments + 0x30),*(sysbvm_tuple_t *)(*arguments + 0x38),
                  gcFrame.argumentNode,*(sysbvm_tuple_t *)gcFrame.name,
                  *(sysbvm_tuple_t *)(*arguments + 0x40),*(sysbvm_tuple_t *)(*arguments + 0x48),
                  *(sysbvm_tuple_t *)(*arguments + 0x50));
  if ((*(long *)(*arguments + 0x58) == 0) ||
     (_Var1 = sysbvm_tuple_boolean_decode(*(sysbvm_tuple_t *)(*arguments + 0x58)), _Var1)) {
    sysbvm_functionDefinition_ensureTypeAnalysis
              (context,(sysbvm_functionDefinition_t **)&gcFrame.argumentCount);
    gcFrame.captureValue =
         sysbvm_function_createClosureWithCaptureEnvironment
                   (context,gcFrame.argumentCount,*(sysbvm_tuple_t *)gcFrame.name);
    sysbvm_environment_enqueuePendingAnalysis
              (context,*(sysbvm_tuple_t *)gcFrame.name,gcFrame.captureValue);
  }
  else {
    sysbvm_functionDefinition_ensureAnalysis
              (context,(sysbvm_functionDefinition_t **)&gcFrame.argumentCount);
    if (*(long *)(gcFrame.argumentCount + 0x80) == 0) {
      if (*(long *)(gcFrame.argumentCount + 0x78) == 0) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:1466: assertion failure: gcFrame.functionDefinition->sourceAnalyzedDefinition"
                  );
      }
      gcFrame.functionDefinition =
           *(sysbvm_functionDefinition_t **)(*(long *)(gcFrame.argumentCount + 0x78) + 0x20);
    }
    else {
      gcFrame.functionDefinition =
           *(sysbvm_functionDefinition_t **)(*(long *)(gcFrame.argumentCount + 0x80) + 0x48);
    }
    sVar2 = sysbvm_array_getSize((sysbvm_tuple_t)gcFrame.functionDefinition);
    gcFrame.captureList =
         sysbvm_sequenceTuple_create(context,*(sysbvm_tuple_t *)(gcFrame.argumentCount + 0x40));
    for (local_e8 = 0; local_e8 < sVar2; local_e8 = local_e8 + 1) {
      binding = sysbvm_array_at((sysbvm_tuple_t)gcFrame.functionDefinition,local_e8);
      gcFrame.captureVector = sysbvm_symbolCaptureBinding_getSourceBinding(binding);
      gcFrame.captureBinding =
           sysbvm_environment_evaluateSymbolBinding
                     (context,*(sysbvm_tuple_t *)gcFrame.name,gcFrame.captureVector);
      sysbvm_array_atPut(gcFrame.captureList,local_e8,gcFrame.captureBinding);
    }
    gcFrame.captureValue =
         sysbvm_function_createClosureWithCaptureVector
                   (context,gcFrame.argumentCount,gcFrame.captureList);
  }
  if ((*(long *)(*arguments + 0x28) != 0) &&
     (gcFrame.closure =
           sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                     (context,*(sysbvm_tuple_t *)(*arguments + 0x28),*(sysbvm_tuple_t *)gcFrame.name
                     ), gcFrame.closure != 0)) {
    sysbvm_environment_setNewSymbolBindingWithValueAtSourcePosition
              (context,*(sysbvm_tuple_t *)gcFrame.name,gcFrame.closure,gcFrame.captureValue,
               *(sysbvm_tuple_t *)(*arguments + 0x10));
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&lambdaArgumentCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return gcFrame.captureValue;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLambdaNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argumentCount;
        sysbvm_functionDefinition_t* functionDefinition;
        
        sysbvm_tuple_t captureList;
        sysbvm_tuple_t captureVector;
        sysbvm_tuple_t captureBinding;
        sysbvm_tuple_t captureValue;
        sysbvm_tuple_t closure;
        sysbvm_tuple_t name;
    } gcFrame = {0};

    sysbvm_astLambdaNode_t **lambdaNode = (sysbvm_astLambdaNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*lambdaNode)->super.sourcePosition);

    // Count the actual argument count.
    size_t lambdaArgumentCount = 0;
    size_t argumentNodeCount = sysbvm_array_getSize((*lambdaNode)->arguments);
    for(size_t i = 0; i < argumentNodeCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*lambdaNode)->arguments, i);
        if(!sysbvm_astArgumentNode_isForAll(gcFrame.argumentNode))
            ++lambdaArgumentCount;
    }

    gcFrame.argumentCount = sysbvm_tuple_size_encode(context,  lambdaArgumentCount);
    gcFrame.functionDefinition = (sysbvm_functionDefinition_t*)sysbvm_functionDefinition_create(context,
        (*lambdaNode)->super.sourcePosition, (*lambdaNode)->flags, (*lambdaNode)->callingConventionName,
        gcFrame.argumentCount, *environment,
        (*lambdaNode)->arguments, (*lambdaNode)->resultType, (*lambdaNode)->body
    );
    
    if((*lambdaNode)->hasLazyAnalysis && !sysbvm_tuple_boolean_decode((*lambdaNode)->hasLazyAnalysis))
    {
        sysbvm_functionDefinition_ensureAnalysis(context, &gcFrame.functionDefinition);

        if(gcFrame.functionDefinition->bytecode)
        {
            gcFrame.captureList = ((sysbvm_functionBytecode_t*)gcFrame.functionDefinition->bytecode)->captures;
        }
        else
        {
            SYSBVM_ASSERT(gcFrame.functionDefinition->sourceAnalyzedDefinition);
            gcFrame.captureList = ((sysbvm_functionSourceAnalyzedDefinition_t*)gcFrame.functionDefinition->sourceAnalyzedDefinition)->captures;
        }

        size_t captureVectorSize = sysbvm_array_getSize(gcFrame.captureList);
        gcFrame.captureVector = sysbvm_sequenceTuple_create(context, gcFrame.functionDefinition->captureVectorType);
        for(size_t i = 0; i < captureVectorSize; ++i)
        {
            gcFrame.captureBinding = sysbvm_symbolCaptureBinding_getSourceBinding(sysbvm_array_at(gcFrame.captureList, i));
            gcFrame.captureValue = sysbvm_environment_evaluateSymbolBinding(context, *environment, gcFrame.captureBinding);
            sysbvm_array_atPut(gcFrame.captureVector, i, gcFrame.captureValue);
        }
        gcFrame.closure = sysbvm_function_createClosureWithCaptureVector(context, (sysbvm_tuple_t)gcFrame.functionDefinition, gcFrame.captureVector);
    }
    else
    {
        sysbvm_functionDefinition_ensureTypeAnalysis(context, &gcFrame.functionDefinition);
        gcFrame.closure = sysbvm_function_createClosureWithCaptureEnvironment(context, (sysbvm_tuple_t)gcFrame.functionDefinition, *environment);
        sysbvm_environment_enqueuePendingAnalysis(context, *environment, gcFrame.closure);
    }

    if((*lambdaNode)->name)
    {
        gcFrame.name = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*lambdaNode)->name, *environment);
        if(gcFrame.name)
            sysbvm_environment_setNewSymbolBindingWithValueAtSourcePosition(context, *environment, gcFrame.name, gcFrame.closure, (*lambdaNode)->super.sourcePosition);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.closure;
}